

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_gej_eq_var(secp256k1_gej *a,secp256k1_gej *b)

{
  secp256k1_gej tmp;
  secp256k1_gej local_b0;
  
  secp256k1_gej_verify(b);
  secp256k1_gej_verify(a);
  secp256k1_gej_neg(&local_b0,a);
  secp256k1_gej_add_var(&local_b0,&local_b0,b,(secp256k1_fe *)0x0);
  secp256k1_gej_verify(&local_b0);
  return local_b0.infinity;
}

Assistant:

static int secp256k1_gej_eq_var(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej tmp;
    secp256k1_gej_verify(b);
    secp256k1_gej_verify(a);
    secp256k1_gej_neg(&tmp, a);
    secp256k1_gej_add_var(&tmp, &tmp, b, NULL);
    return secp256k1_gej_is_infinity(&tmp);
}